

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Runner2::makeReporter(Runner2 *this)

{
  ConfigData *pCVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  undefined4 extraout_var;
  IRegistryHub *pIVar5;
  undefined4 extraout_var_00;
  IReporter *p;
  ostream *poVar6;
  domain_error *this_00;
  string local_2d0 [32];
  ostringstream local_2b0 [8];
  ostringstream oss;
  undefined1 local_138 [8];
  ReporterConfig reporterConfig;
  allocator<char> local_31;
  string local_30 [8];
  string reporterName;
  Runner2 *this_local;
  
  reporterName.field_2._8_8_ = this;
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::__cxx11::string::string(local_30,(string *)this->m_config);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_30,"basic",&local_31);
    std::allocator<char>::~allocator(&local_31);
  }
  pCVar1 = this->m_config;
  iVar3 = (*(this->m_configWrapper->super_IConfig)._vptr_IConfig[4])();
  ReporterConfig::ReporterConfig
            ((ReporterConfig *)local_138,&pCVar1->name,(ostream *)CONCAT44(extraout_var,iVar3),
             this->m_config->includeWhichResults == SuccessfulResults,this->m_config);
  pIVar5 = getRegistryHub();
  iVar3 = (*pIVar5->_vptr_IRegistryHub[2])();
  p = (IReporter *)
      (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x10))
                ((long *)CONCAT44(extraout_var_00,iVar3),local_30,local_138);
  Ptr<Catch::IReporter>::operator=(&this->m_reporter,p);
  bVar2 = Ptr<Catch::IReporter>::operator!(&this->m_reporter);
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_2b0);
    poVar6 = std::operator<<((ostream *)local_2b0,"No reporter registered with name: \'");
    poVar6 = std::operator<<(poVar6,local_30);
    std::operator<<(poVar6,"\'");
    this_00 = (domain_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::domain_error::domain_error(this_00,local_2d0);
    __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  ReporterConfig::~ReporterConfig((ReporterConfig *)local_138);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void makeReporter() {
            std::string reporterName = m_config.reporter.empty()
            ? "basic"
            : m_config.reporter;

            ReporterConfig reporterConfig( m_config.name, m_configWrapper.stream(), m_config.includeWhichResults == Include::SuccessfulResults, m_config );

            m_reporter = getRegistryHub().getReporterRegistry().create( reporterName, reporterConfig );
            if( !m_reporter ) {
                std::ostringstream oss;
                oss << "No reporter registered with name: '" << reporterName << "'";
                throw std::domain_error( oss.str() );
            }
        }